

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O2

PrimitiveType sglr::rr_util::mapGLPrimitiveType(deUint32 type)

{
  if (type < 0xe) {
    return *(PrimitiveType *)(&DAT_005eec00 + (ulong)type * 4);
  }
  return PRIMITIVETYPE_LAST;
}

Assistant:

rr::PrimitiveType mapGLPrimitiveType (deUint32 type)
{
	switch (type)
	{
		case GL_TRIANGLES:					return rr::PRIMITIVETYPE_TRIANGLES;
		case GL_TRIANGLE_STRIP:				return rr::PRIMITIVETYPE_TRIANGLE_STRIP;
		case GL_TRIANGLE_FAN:				return rr::PRIMITIVETYPE_TRIANGLE_FAN;
		case GL_LINES:						return rr::PRIMITIVETYPE_LINES;
		case GL_LINE_STRIP:					return rr::PRIMITIVETYPE_LINE_STRIP;
		case GL_LINE_LOOP:					return rr::PRIMITIVETYPE_LINE_LOOP;
		case GL_POINTS:						return rr::PRIMITIVETYPE_POINTS;
		case GL_LINES_ADJACENCY:			return rr::PRIMITIVETYPE_LINES_ADJACENCY;
		case GL_LINE_STRIP_ADJACENCY:		return rr::PRIMITIVETYPE_LINE_STRIP_ADJACENCY;
		case GL_TRIANGLES_ADJACENCY:		return rr::PRIMITIVETYPE_TRIANGLES_ADJACENCY;
		case GL_TRIANGLE_STRIP_ADJACENCY:	return rr::PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY;
		default:
			DE_ASSERT(false);
			return rr::PRIMITIVETYPE_LAST;
	}
}